

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UConverter * ucnv_openU_63(UChar *name,UErrorCode *err)

{
  UBool UVar1;
  int32_t iVar2;
  UConverter *pUVar3;
  char *name_00;
  char local_68 [8];
  char asciiName [60];
  UErrorCode *err_local;
  UChar *name_local;
  
  if ((err == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*err), UVar1 != '\0')) {
    return (UConverter *)0x0;
  }
  if (name == (UChar *)0x0) {
    pUVar3 = ucnv_open_63((char *)0x0,err);
    return pUVar3;
  }
  iVar2 = u_strlen_63(name);
  if (0x3b < iVar2) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return (UConverter *)0x0;
  }
  name_00 = u_austrcpy_63(local_68,name);
  pUVar3 = ucnv_open_63(name_00,err);
  return pUVar3;
}

Assistant:

U_CAPI UConverter*   U_EXPORT2
ucnv_openU (const UChar * name,
                         UErrorCode * err)
{
    char asciiName[UCNV_MAX_CONVERTER_NAME_LENGTH];

    if (err == NULL || U_FAILURE(*err))
        return NULL;
    if (name == NULL)
        return ucnv_open (NULL, err);
    if (u_strlen(name) >= UCNV_MAX_CONVERTER_NAME_LENGTH)
    {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    return ucnv_open(u_austrcpy(asciiName, name), err);
}